

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapDrive.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_580a1::MapDriver::reset(MapDriver *this)

{
  int iVar1;
  undefined8 extraout_XMM0_Qa;
  
  OpenSteer::SimpleVehicle::reset(&this->super_SimpleVehicle);
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x1c])(0,this);
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x21])(0x41a00000,this);
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x20])(this);
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x1f])
            (CONCAT44((int)((ulong)extraout_XMM0_Qa >> 0x20),(float)extraout_XMM0_Qa * 0.4),this);
  this->halfWidth = 1.0;
  this->halfLength = 1.5;
  adjustVehicleRadiusForSpeed(this);
  OpenSteer::Vec3::operator=(&this->annotateAvoid,&OpenSteer::Vec3::zero);
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  clearTrailHistory((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)this
                   );
  this->stuck = false;
  OpenSteer::Vec3::operator=(&this->qqqLastNearestObstacle,&OpenSteer::Vec3::zero);
  this->baseLookAheadTime = 3.0;
  if ((anonymous_namespace)::MapDriver::demoSelect == 2) {
    this->lapsStarted = this->lapsStarted + 1;
    iVar1 = this->pathFollowDirection;
    (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
      super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
      super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
      super_AbstractLocalSpace._vptr_AbstractLocalSpace[9])
              ((ulong)(uint)((float)iVar1 * 200.0 * 0.6),0xc2a00000,this);
    OpenSteer::Vec3::operator*(&OpenSteer::Vec3::side,(float)iVar1);
    (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
      super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
      super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
      super_AbstractLocalSpace._vptr_AbstractLocalSpace[0x11])(this);
  }
  resetStuckCycleDetection(this);
  OpenSteer::Vec3::operator=(&this->currentSteering,&OpenSteer::Vec3::zero);
  this->dtZero = false;
  this->QQQoaJustScraping = false;
  return;
}

Assistant:

void reset (void)
        {
            // reset the underlying vehicle class
            SimpleVehicle::reset ();

            // initially stopped
            setSpeed (0);

            // Assume top speed is 20 meters per second (44.7 miles per hour).
            // This value will eventually be supplied by a higher level module.
            setMaxSpeed (20);

            // steering force is clipped to this magnitude
            setMaxForce (maxSpeed () * 0.4f);

            // vehicle is 2 meters wide and 3 meters long
            halfWidth = 1.0f;
            halfLength = 1.5f;

            // init dynamically controlled radius
            adjustVehicleRadiusForSpeed ();

            // not previously avoiding
            annotateAvoid = Vec3::zero;

            // prevent long streaks due to teleportation 
            clearTrailHistory ();

            // first pass at detecting "stuck" state
            stuck = false;

            // QQQ need to clean up this hack
            qqqLastNearestObstacle = Vec3::zero;

            // master look ahead (prediction) time
            baseLookAheadTime = 3;

            if (demoSelect == 2)
            {
                lapsStarted++;
                const float s = worldSize;
                const float d = (float) pathFollowDirection;
                setPosition (Vec3 (s * d * 0.6f, 0, s * -0.4f));
                regenerateOrthonormalBasisUF (Vec3::side * d);
            }

            // reset bookeeping to detect stuck cycles
            resetStuckCycleDetection ();

            // assume no previous steering
            currentSteering = Vec3::zero;

            // assume normal running state
            dtZero = false;

            // QQQ temporary global QQQoaJustScraping
            QQQoaJustScraping = false;

            // state saved for speedometer
    //      annoteMaxRelSpeed = annoteMaxRelSpeedCurve = annoteMaxRelSpeedPath = 0;
    //      annoteMaxRelSpeed = annoteMaxRelSpeedCurve = annoteMaxRelSpeedPath = 1;
        }